

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int bb_serial_read(uint user_gpio,void *buf,size_t bufSize)

{
  int sent;
  
  sent = pigpio_command(gPigCommand,0x2b,user_gpio,(int)bufSize,0);
  if (0 < sent) {
    sent = recvMax(buf,(int)bufSize,sent);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return sent;
}

Assistant:

int bb_serial_read(unsigned user_gpio, void *buf, size_t bufSize)
{
   int bytes;

   bytes = pigpio_command(gPigCommand, PI_CMD_SLR, user_gpio, bufSize, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, bufSize, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}